

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LicenseReader.cpp
# Opt level: O0

void __thiscall license::FullLicenseInfo::printAsIni(FullLicenseInfo *this,ostream *a_ostream)

{
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  long lVar4;
  undefined1 local_100 [8];
  StreamWriter sw;
  string local_e0;
  undefined1 local_c0 [8];
  string product;
  string result;
  CSimpleIniA ini;
  ostream *a_ostream_local;
  FullLicenseInfo *this_local;
  
  CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::CSimpleIniTempl
            ((CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *)
             ((long)&result.field_2 + 8),false,false,false);
  std::__cxx11::string::string((string *)(product.field_2._M_local_buf + 8));
  trim_copy(&local_e0,&this->product);
  toupper_copy((string *)local_c0,&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::StreamWriter::StreamWriter
            ((StreamWriter *)local_100,a_ostream);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::SetLongValue
            ((CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *)
             ((long)&result.field_2 + 8),pcVar2,"license_version",0x6e,(char *)0x0,false,false);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::SetValue
            ((CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *)
             ((long)&result.field_2 + 8),pcVar2,"license_signature",pcVar3,(char *)0x0,false);
  if ((this->has_client_sig & 1U) != 0) {
    pcVar2 = (char *)std::__cxx11::string::c_str();
    pcVar3 = (char *)std::__cxx11::string::c_str();
    CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::SetValue
              ((CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *)
               ((long)&result.field_2 + 8),pcVar2,"client_signature",pcVar3,(char *)0x0,false);
  }
  if ((this->has_versions & 1U) != 0) {
    pcVar2 = (char *)std::__cxx11::string::c_str();
    CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::SetLongValue
              ((CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *)
               ((long)&result.field_2 + 8),pcVar2,"from_sw_version",(ulong)this->from_sw_version,
               (char *)0x0,false,false);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::SetLongValue
              ((CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *)
               ((long)&result.field_2 + 8),pcVar2,"to_sw_version",(ulong)this->to_sw_version,
               (char *)0x0,false,false);
  }
  bVar1 = std::operator!=(&this->from_date,UNUSED_TIME);
  if (bVar1) {
    pcVar2 = (char *)std::__cxx11::string::c_str();
    pcVar3 = (char *)std::__cxx11::string::c_str();
    CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::SetValue
              ((CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *)
               ((long)&result.field_2 + 8),pcVar2,"from_date",pcVar3,(char *)0x0,false);
  }
  bVar1 = std::operator!=(&this->to_date,UNUSED_TIME);
  if (bVar1) {
    pcVar2 = (char *)std::__cxx11::string::c_str();
    pcVar3 = (char *)std::__cxx11::string::c_str();
    CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::SetValue
              ((CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *)
               ((long)&result.field_2 + 8),pcVar2,"to_date",pcVar3,(char *)0x0,false);
  }
  lVar4 = std::__cxx11::string::length();
  if (lVar4 != 0) {
    pcVar2 = (char *)std::__cxx11::string::c_str();
    pcVar3 = (char *)std::__cxx11::string::c_str();
    CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::SetValue
              ((CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *)
               ((long)&result.field_2 + 8),pcVar2,"extra_data",pcVar3,(char *)0x0,false);
  }
  CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Save
            ((CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *)
             ((long)&result.field_2 + 8),(OutputWriter *)local_100,false);
  CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::StreamWriter::~StreamWriter
            ((StreamWriter *)local_100);
  std::__cxx11::string::~string((string *)local_c0);
  std::__cxx11::string::~string((string *)(product.field_2._M_local_buf + 8));
  CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::~CSimpleIniTempl
            ((CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *)
             ((long)&result.field_2 + 8));
  return;
}

Assistant:

void FullLicenseInfo::printAsIni(ostream & a_ostream) const {
	CSimpleIniA ini;
	string result;
	string product = toupper_copy(trim_copy(this->product));
	CSimpleIniA::StreamWriter sw(a_ostream);
	ini.SetLongValue(product.c_str(), "license_version",
	PROJECT_INT_VERSION);
	ini.SetValue(product.c_str(), "license_signature",
			this->license_signature.c_str());
	if (has_client_sig) {
		ini.SetValue(product.c_str(), "client_signature",
				this->client_signature.c_str());
	}
	if (has_versions) {
		ini.SetLongValue(product.c_str(), "from_sw_version", from_sw_version);
		ini.SetLongValue(product.c_str(), "to_sw_version", to_sw_version);
	}

	if (this->from_date != UNUSED_TIME) {
		ini.SetValue(product.c_str(), "from_date", from_date.c_str());
	}
	if (this->to_date != UNUSED_TIME) {
		ini.SetValue(product.c_str(), "to_date", to_date.c_str());
	}
	if (this->extra_data.length() > 0) {
		ini.SetValue(product.c_str(), "extra_data", this->extra_data.c_str());
	}
	ini.Save(sw);
}